

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

wchar_t archive_acl_parse_l(archive_acl *acl,char *text,wchar_t default_type,archive_string_conv *sc
                           )

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  archive_acl *acl_00;
  byte *pbVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  archive_acl_entry *paVar9;
  byte *pbVar10;
  wchar_t wVar11;
  int *piVar12;
  ulong uVar13;
  wchar_t wVar14;
  byte *pbVar15;
  char *pcVar16;
  ulong uVar17;
  int iVar18;
  wchar_t permset;
  anon_struct_16_2_267fbce2 field [4];
  wchar_t local_b0;
  wchar_t local_ac;
  byte *local_a8;
  byte *local_a0;
  wchar_t local_98;
  wchar_t local_94;
  ulong local_90;
  int *local_88 [4];
  char *local_68;
  char *local_60;
  byte *local_58;
  byte *local_50;
  archive_string_conv *local_40;
  archive_acl *local_38;
  
  if ((text == (char *)0x0) || (*text == '\0')) {
    return L'\0';
  }
  uVar17 = 0;
  local_94 = default_type;
  local_40 = sc;
  local_38 = acl;
  do {
    uVar1 = 0;
    do {
      while ((uVar13 = uVar1, pbVar10 = (byte *)text, (ulong)(byte)*text < 0x21 &&
             ((0x100000600U >> ((ulong)(byte)*text & 0x3f) & 1) != 0))) {
        text = (char *)((byte *)text + 1);
        uVar1 = uVar13;
      }
      while( true ) {
        bVar2 = *pbVar10;
        if (((ulong)bVar2 < 0x3b) &&
           (pbVar6 = pbVar10, (0x400100000000401U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) break;
        pbVar10 = pbVar10 + 1;
      }
      do {
        pbVar15 = pbVar6;
        if (0x20 < (ulong)pbVar15[-1]) break;
        pbVar6 = pbVar15 + -1;
      } while ((0x100000600U >> ((ulong)pbVar15[-1] & 0x3f) & 1) != 0);
      bVar3 = *pbVar10;
      if (uVar13 < 4) {
        local_88[uVar13 * 2] = (int *)text;
        local_88[uVar13 * 2 + 1] = (int *)pbVar15;
      }
      uVar1 = uVar13 + 1;
      text = (char *)(pbVar10 + (bVar3 != 0));
    } while (bVar2 == 0x3a);
    text = (char *)(pbVar10 + (bVar3 != 0));
    if (uVar13 < 3) {
      memset(local_88 + uVar13 * 2 + 2,0,(uVar13 * -0x10 + 0x20 & 0xffffffff0) + 0x10);
    }
    if (local_88[2] < local_88[3]) {
      wVar7 = L'\0';
      pbVar10 = (byte *)local_88[2];
      do {
        bVar2 = *pbVar10;
        if ((byte)(bVar2 - 0x3a) < 0xf6) goto LAB_0051ac6c;
        wVar14 = L'\x7fffffff';
        if ((wVar7 < L'\x0ccccccd') && ((wVar7 != L'\x0ccccccc' || ((char)bVar2 < '8')))) {
          wVar14 = (uint)bVar2 + wVar7 * 10 + L'\xffffffd0';
        }
        wVar7 = wVar14;
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 != (byte *)local_88[3]);
    }
    else {
LAB_0051ac6c:
      wVar7 = L'\xffffffff';
    }
    local_98 = wVar7;
    if ((2 < uVar13 && wVar7 == L'\xffffffff') && (local_58 < local_50)) {
      wVar14 = L'\0';
      pbVar10 = local_58;
      do {
        bVar2 = *pbVar10;
        local_98 = wVar7;
        if ((byte)(bVar2 - 0x3a) < 0xf6) break;
        wVar8 = L'\x7fffffff';
        if ((wVar14 < L'\x0ccccccd') && ((wVar14 != L'\x0ccccccc' || ((char)bVar2 < '8')))) {
          wVar8 = (uint)bVar2 + wVar14 * 10 + L'\xffffffd0';
        }
        wVar14 = wVar8;
        pbVar10 = pbVar10 + 1;
        local_98 = wVar14;
      } while (pbVar10 != local_50);
    }
    local_b0 = local_94;
    if ((7 < (long)local_88[1] - (long)local_88[0]) &&
       (*(int *)((long)local_88[0] + 3) == 0x746c7561 && *local_88[0] == 0x61666564)) {
      local_88[0] = (int *)((long)local_88[0] + 7);
      local_b0 = L'Ȁ';
    }
    if (local_88[0] == local_88[1]) {
      return L'\xffffffec';
    }
    local_a0 = (byte *)local_88[3];
    local_a8 = (byte *)local_88[2];
    local_90 = uVar17;
    if ((char)*local_88[0] == 'u') {
      piVar12 = (int *)((long)local_88[0] + 1);
      pcVar16 = "ser";
      do {
        if (local_88[1] <= piVar12) break;
        iVar18 = *piVar12;
        piVar12 = (int *)((long)piVar12 + 1);
        cVar4 = *pcVar16;
        pcVar16 = pcVar16 + 1;
      } while ((char)iVar18 == cVar4);
      if (piVar12 < local_88[1]) goto LAB_0051ad76;
      wVar7 = ismode(local_68,local_60,&local_ac);
      if (wVar7 == L'\0') {
        return L'\xffffffec';
      }
      if ((local_a8 < local_a0) || (local_98 != L'\xffffffff')) {
        wVar7 = L'✑';
        goto LAB_0051afb2;
      }
      wVar7 = L'✒';
LAB_0051afa0:
      local_a0 = (byte *)0x0;
      local_a8 = (byte *)0x0;
    }
    else {
LAB_0051ad76:
      if (local_88[0] == local_88[1]) {
        return L'\xffffffec';
      }
      if ((char)*local_88[0] != 'g') {
LAB_0051adaf:
        if (local_88[0] == local_88[1]) {
          return L'\xffffffec';
        }
        iVar18 = (int)uVar13;
        if ((char)*local_88[0] == 'o') {
          piVar12 = (int *)((long)local_88[0] + 1);
          pcVar16 = "other";
          do {
            pcVar16 = pcVar16 + 1;
            if (local_88[1] <= piVar12) break;
            iVar5 = *piVar12;
            piVar12 = (int *)((long)piVar12 + 1);
          } while ((char)iVar5 == *pcVar16);
          if (local_88[1] <= piVar12) {
            if (iVar18 == 2) {
LAB_0051af68:
              if (local_a8 != local_a0) {
                return L'\xffffffec';
              }
              if (local_60 <= local_68) {
                return L'\xffffffec';
              }
              wVar7 = ismode(local_68,local_60,&local_ac);
              if (wVar7 == L'\0') {
                return L'\xffffffec';
              }
            }
            else {
              if (iVar18 != 1) {
                return L'\xffffffec';
              }
              if ((local_88[3] <= local_88[2]) ||
                 (wVar7 = ismode((char *)local_88[2],(char *)local_88[3],&local_ac), wVar7 == L'\0')
                 ) {
                if (uVar1 != 3) {
                  return L'\xffffffec';
                }
                goto LAB_0051af68;
              }
            }
            wVar7 = L'✖';
            goto LAB_0051afa0;
          }
        }
        if (local_88[0] == local_88[1]) {
          return L'\xffffffec';
        }
        if ((char)*local_88[0] != 'm') {
          return L'\xffffffec';
        }
        piVar12 = (int *)((long)local_88[0] + 1);
        pcVar16 = "mask";
        do {
          pcVar16 = pcVar16 + 1;
          if (local_88[1] <= piVar12) break;
          iVar5 = *piVar12;
          piVar12 = (int *)((long)piVar12 + 1);
        } while ((char)iVar5 == *pcVar16);
        if (piVar12 < local_88[1]) {
          return L'\xffffffec';
        }
        if (iVar18 == 2) {
LAB_0051ae68:
          if ((local_a8 != local_a0) || (local_60 <= local_68)) {
            return L'\xffffffec';
          }
          wVar7 = ismode(local_68,local_60,&local_ac);
          if (wVar7 == L'\0') {
            return L'\xffffffec';
          }
        }
        else {
          if (iVar18 != 1) {
            return L'\xffffffec';
          }
          if ((local_88[3] <= local_88[2]) ||
             (wVar7 = ismode((char *)local_88[2],(char *)local_88[3],&local_ac), wVar7 == L'\0')) {
            if (uVar1 != 3) {
              return L'\xffffffec';
            }
            goto LAB_0051ae68;
          }
        }
        wVar7 = L'✕';
        goto LAB_0051afa0;
      }
      piVar12 = (int *)((long)local_88[0] + 1);
      pcVar16 = "roup";
      do {
        if (local_88[1] <= piVar12) break;
        iVar18 = *piVar12;
        piVar12 = (int *)((long)piVar12 + 1);
        cVar4 = *pcVar16;
        pcVar16 = pcVar16 + 1;
      } while ((char)iVar18 == cVar4);
      if (piVar12 < local_88[1]) goto LAB_0051adaf;
      wVar7 = ismode(local_68,local_60,&local_ac);
      if (wVar7 == L'\0') {
        return L'\xffffffec';
      }
      if ((local_a0 <= local_a8) && (local_98 == L'\xffffffff')) {
        wVar7 = L'✔';
        goto LAB_0051afa0;
      }
      wVar7 = L'✓';
    }
LAB_0051afb2:
    acl_00 = local_38;
    wVar14 = local_ac;
    wVar8 = acl_special(local_38,local_b0,local_ac,wVar7);
    wVar11 = L'\0';
    uVar17 = local_90;
    if (wVar8 != L'\0') {
      paVar9 = acl_new_entry(acl_00,local_b0,wVar14,wVar7,local_98);
      uVar17 = local_90;
      if (paVar9 == (archive_acl_entry *)0x0) {
        wVar11 = L'\xffffffe7';
      }
      else if (((local_a8 == (byte *)0x0) || (local_a0 == local_a8)) || (*local_a8 == 0)) {
        archive_mstring_clean(&paVar9->name);
        wVar11 = L'\0';
      }
      else {
        wVar7 = archive_mstring_copy_mbs_len_l
                          (&paVar9->name,(char *)local_a8,(long)local_a0 - (long)local_a8,local_40);
        wVar11 = L'\0';
        if (wVar7 != L'\0') {
          piVar12 = __errno_location();
          wVar11 = L'\xffffffec';
          if (*piVar12 == 0xc) {
            wVar11 = L'\xffffffe2';
          }
        }
      }
    }
    if (wVar11 < L'\xffffffec') {
      return wVar11;
    }
    uVar17 = uVar17 & 0xffffffff;
    if (wVar11 != L'\0') {
      uVar17 = 0xffffffec;
    }
    if (*text == 0) {
      return (wchar_t)uVar17;
    }
  } while( true );
}

Assistant:

int
archive_acl_parse_l(struct archive_acl *acl,
    const char *text, int default_type, struct archive_string_conv *sc)
{
	struct {
		const char *start;
		const char *end;
	} field[4], name;

	int fields, n, r, ret = ARCHIVE_OK;
	int type, tag, permset, id;
	char sep;

	while (text != NULL  &&  *text != '\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const char *start, *end;
			next_field(&text, &start, &end, &sep);
			if (fields < 4) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == ':');

		/* Set remaining fields to blank. */
		for (n = fields; n < 4; ++n)
			field[n].start = field[n].end = NULL;

		/* Check for a numeric ID in field 1 or 3. */
		id = -1;
		isint(field[1].start, field[1].end, &id);
		/* Field 3 is optional. */
		if (id == -1 && fields > 3)
			isint(field[3].start, field[3].end, &id);

		/*
		 * Solaris extension:  "defaultuser::rwx" is the
		 * default ACL corresponding to "user::rwx", etc.
		 */
		if (field[0].end - field[0].start > 7
		    && memcmp(field[0].start, "default", 7) == 0) {
			type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
			field[0].start += 7;
		} else
			type = default_type;

		name.start = name.end = NULL;
		if (prefix_c(field[0].start, field[0].end, "user")) {
			if (!ismode(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_USER;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
		} else if (prefix_c(field[0].start, field[0].end, "group")) {
			if (!ismode(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_GROUP;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
		} else if (prefix_c(field[0].start, field[0].end, "other")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "other:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "other::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_OTHER;
		} else if (prefix_c(field[0].start, field[0].end, "mask")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "mask:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "mask::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_MASK;
		} else
			return (ARCHIVE_WARN);

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_len_l(acl, type, permset,
		    tag, id, name.start, name.end - name.start, sc);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
	}
	return (ret);
}